

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

bool __thiscall wasm::RandomLattice::join(RandomLattice *this,Element *a,Element *b)

{
  LatticeImpl *pLVar1;
  variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
  *pvVar2;
  variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
  *pvVar3;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  anon_class_1_0_00000001 local_9;
  
  pLVar1 = (this->lattice)._M_t.
           super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
  lVar7 = (long)(char)*(__index_type *)
                       &((_Variadic_union<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                          *)&(pLVar1->super_LatticeVariant).
                             super__Variant_base<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                             .
                             super__Move_assign_alias<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                             .
                             super__Copy_assign_alias<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                             .
                             super__Move_ctor_alias<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                             .
                             super__Copy_ctor_alias<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                             .
                             super__Variant_storage_alias<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                             ._M_index)->_M_first;
  if (lVar7 != -1) {
    pvVar2 = (variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
              *)(a->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_void_*,_false>._M_head_impl;
    lVar8 = (long)(char)(pvVar2->
                        super__Variant_base<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        ).
                        super__Move_assign_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        .
                        super__Copy_assign_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        .
                        super__Move_ctor_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        .
                        super__Copy_ctor_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        .
                        super__Variant_storage_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        ._M_index;
    if (lVar8 != -1) {
      pvVar3 = (variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                *)(b->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl;
      lVar5 = (long)(char)(pvVar3->
                          super__Variant_base<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          ).
                          super__Move_assign_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          .
                          super__Copy_assign_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          .
                          super__Move_ctor_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          .
                          super__Copy_ctor_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          .
                          super__Variant_storage_alias<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          ._M_index;
      if (lVar5 != -1) {
        bVar4 = (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:969:5)_&&,_const_std::variant<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>_&,_std::variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>_&,_const_std::variant<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>_&>
                  ::_S_vtable._M_arr[lVar7]._M_arr[lVar8]._M_arr[lVar5]._M_data)
                          (&local_9,&pLVar1->super_LatticeVariant,pvVar2,pvVar3);
        return bVar4;
      }
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar6 = &PTR__exception_001ed3e8;
  puVar6[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar6,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

bool RandomLattice::join(Element& a, const Element& b) const noexcept {
  return std::visit(
    [](const auto& l, auto& elemA, const auto& elemB) -> bool {
      using ElemT = typename bare<decltype(l)>::Element;
      using A = bare<decltype(elemA)>;
      using B = bare<decltype(elemB)>;
      if constexpr (std::is_same_v<ElemT, A> && std::is_same_v<ElemT, B>) {
        return l.join(elemA, elemB);
      }
      WASM_UNREACHABLE("unexpected element types");
    },
    (const LatticeVariant&)*lattice,
    (LatticeElementVariant&)*a,
    (const LatticeElementVariant&)*b);
}